

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O0

void __thiscall
OpenMD::Quaternion<double>::toTwistSwing(Quaternion<double> *this,double *tw,double *sx,double *sy)

{
  double *pdVar1;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  Quaternion<double> *in_RDI;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double cost;
  double sint;
  double sins;
  double y;
  double x;
  double s;
  double t;
  double qz;
  double qy;
  double qx;
  double qw;
  double local_60;
  double local_58;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  pdVar1 = z(in_RDI);
  if ((((-1e-06 < *pdVar1) && (pdVar1 = z(in_RDI), *pdVar1 <= 1e-06 && *pdVar1 != 1e-06)) &&
      (pdVar1 = w(in_RDI), -1e-06 < *pdVar1)) &&
     (pdVar1 = w(in_RDI), *pdVar1 <= 1e-06 && *pdVar1 != 1e-06)) {
    *in_RCX = 3.141592653589793;
    *in_RDX = 3.141592653589793;
    *in_RSI = 0.0;
    return;
  }
  pdVar1 = w(in_RDI);
  if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
    pdVar1 = w(in_RDI);
    local_28 = *pdVar1;
    pdVar1 = Quaternion<double>::x(in_RDI);
    local_30 = *pdVar1;
    pdVar1 = Quaternion<double>::y(in_RDI);
    local_38 = *pdVar1;
    pdVar1 = z(in_RDI);
    local_40 = *pdVar1;
  }
  else {
    pdVar1 = w(in_RDI);
    local_28 = -*pdVar1;
    pdVar1 = Quaternion<double>::x(in_RDI);
    local_30 = -*pdVar1;
    pdVar1 = Quaternion<double>::y(in_RDI);
    local_38 = -*pdVar1;
    pdVar1 = z(in_RDI);
    local_40 = -*pdVar1;
  }
  __x = atan2(local_40,local_28);
  dVar2 = sqrt(local_30 * local_30 + local_38 * local_38);
  dVar3 = sqrt(local_40 * local_40 + local_28 * local_28);
  dVar2 = atan2(dVar2,dVar3);
  local_58 = 0.0;
  local_60 = 0.0;
  dVar3 = sin(dVar2);
  if ((dVar3 <= -1e-06) || (1e-06 <= dVar3)) {
    dVar4 = sin(__x);
    dVar5 = cos(__x);
    local_60 = (-local_30 * dVar4 + local_38 * dVar5) / dVar3;
    local_58 = (local_30 * dVar5 + local_38 * dVar4) / dVar3;
  }
  *in_RSI = __x * 2.0;
  *in_RDX = local_58 * 2.0 * dVar2;
  *in_RCX = local_60 * 2.0 * dVar2;
  return;
}

Assistant:

void toTwistSwing(Real& tw, Real& sx, Real& sy) {
      // First test if the swing is in the singularity:

      if (ISZERO(z(), tiny) && ISZERO(w(), tiny)) {
        sx = sy = Constants::PI;
        tw      = 0;
        return;
      }

      // Decompose into twist-swing by solving the equation:
      //
      //                       Qtwist(t*2) * Qswing(s*2) = q
      //
      // note: (x,y) is the normalized swing axis (x*x+y*y=1)
      //
      //          ( Ct 0 0 St ) * ( Cs xSs ySs 0 ) = ( qw qx qy qz )
      //  ( CtCs  xSsCt-yStSs  xStSs+ySsCt  StCs ) = ( qw qx qy qz )      (1)
      // From (1): CtCs / StCs = qw/qz => Ct/St = qw/qz => tan(t) = qz/qw (2)
      //
      // The swing rotation/2 s comes from:
      //
      // From (1): (CtCs)^2 + (StCs)^2 = qw^2 + qz^2 =>
      //                                       Cs = sqrt ( qw^2 + qz^2 ) (3)
      //
      // From (1): (xSsCt-yStSs)^2 + (xStSs+ySsCt)^2 = qx^2 + qy^2 =>
      //                                       Ss = sqrt ( qx^2 + qy^2 ) (4)
      // From (1):  |SsCt -StSs| |x| = |qx|
      //            |StSs +SsCt| |y|   |qy|                              (5)

      Real qw, qx, qy, qz;

      if (w() < 0) {
        qw = -w();
        qx = -x();
        qy = -y();
        qz = -z();
      } else {
        qw = w();
        qx = x();
        qy = y();
        qz = z();
      }

      Real t = atan2(qz, qw);  // from (2)
      Real s =
          atan2(sqrt(qx * qx + qy * qy), sqrt(qz * qz + qw * qw));  // from (3)
                                                                    // and (4)

      Real x = 0.0, y = 0.0, sins = sin(s);

      if (!ISZERO(sins, tiny)) {
        Real sint = sin(t);
        Real cost = cos(t);

        // by solving the linear system in (5):
        y = (-qx * sint + qy * cost) / sins;
        x = (qx * cost + qy * sint) / sins;
      }

      tw = (Real)2.0 * t;
      sx = (Real)2.0 * x * s;
      sy = (Real)2.0 * y * s;
    }